

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

U32 ZSTD_window_correctOverflow(ZSTD_window_t *window,U32 cycleLog,U32 maxDist,void *src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint local_4c;
  uint local_44;
  uint local_40;
  U32 correction;
  U32 newCurrent;
  U32 currentCycleCorrection;
  U32 currentCycle;
  U32 curr;
  U32 cycleMask;
  U32 cycleSize;
  void *src_local;
  U32 maxDist_local;
  U32 cycleLog_local;
  ZSTD_window_t *window_local;
  
  local_4c = 1 << ((byte)cycleLog & 0x1f);
  uVar1 = local_4c - 1;
  uVar2 = (int)src - (int)window->base;
  if ((uVar2 & uVar1) < 2) {
    local_40 = local_4c;
    if (local_4c < 3) {
      local_40 = 2;
    }
    local_44 = local_40;
  }
  else {
    local_44 = 0;
  }
  if (local_4c < maxDist) {
    local_4c = maxDist;
  }
  uVar3 = (uVar2 & uVar1) + local_44 + local_4c;
  uVar4 = uVar2 - uVar3;
  if ((maxDist & maxDist - 1) != 0) {
    __assert_fail("(maxDist & (maxDist - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x446,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)")
    ;
  }
  if ((uVar2 & uVar1) != (uVar3 & uVar1)) {
    __assert_fail("(curr & cycleMask) == (newCurrent & cycleMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x447,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)")
    ;
  }
  if (uVar2 <= uVar3) {
    __assert_fail("curr > newCurrent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x448,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)")
    ;
  }
  if (uVar4 < 0x10000001) {
    __assert_fail("correction > 1<<28",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,1099,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
  }
  window->base = window->base + uVar4;
  window->dictBase = window->dictBase + uVar4;
  if (window->lowLimit < uVar4 + 2) {
    window->lowLimit = 2;
  }
  else {
    window->lowLimit = window->lowLimit - uVar4;
  }
  if (window->dictLimit < uVar4 + 2) {
    window->dictLimit = 2;
  }
  else {
    window->dictLimit = window->dictLimit - uVar4;
  }
  if (uVar3 < maxDist) {
    __assert_fail("newCurrent >= maxDist",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x45c,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)")
    ;
  }
  if (uVar3 - maxDist < 2) {
    __assert_fail("newCurrent - maxDist >= ZSTD_WINDOW_START_INDEX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x45d,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)")
    ;
  }
  if (uVar3 < window->lowLimit) {
    __assert_fail("window->lowLimit <= newCurrent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x45f,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)")
    ;
  }
  if (uVar3 < window->dictLimit) {
    __assert_fail("window->dictLimit <= newCurrent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x460,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)")
    ;
  }
  window->nbOverflowCorrections = window->nbOverflowCorrections + 1;
  return uVar4;
}

Assistant:

MEM_STATIC U32 ZSTD_window_correctOverflow(ZSTD_window_t* window, U32 cycleLog,
                                           U32 maxDist, void const* src)
{
    /* preemptive overflow correction:
     * 1. correction is large enough:
     *    lowLimit > (3<<29) ==> current > 3<<29 + 1<<windowLog
     *    1<<windowLog <= newCurrent < 1<<chainLog + 1<<windowLog
     *
     *    current - newCurrent
     *    > (3<<29 + 1<<windowLog) - (1<<windowLog + 1<<chainLog)
     *    > (3<<29) - (1<<chainLog)
     *    > (3<<29) - (1<<30)             (NOTE: chainLog <= 30)
     *    > 1<<29
     *
     * 2. (ip+ZSTD_CHUNKSIZE_MAX - cctx->base) doesn't overflow:
     *    After correction, current is less than (1<<chainLog + 1<<windowLog).
     *    In 64-bit mode we are safe, because we have 64-bit ptrdiff_t.
     *    In 32-bit mode we are safe, because (chainLog <= 29), so
     *    ip+ZSTD_CHUNKSIZE_MAX - cctx->base < 1<<32.
     * 3. (cctx->lowLimit + 1<<windowLog) < 1<<32:
     *    windowLog <= 31 ==> 3<<29 + 1<<windowLog < 7<<29 < 1<<32.
     */
    U32 const cycleSize = 1u << cycleLog;
    U32 const cycleMask = cycleSize - 1;
    U32 const curr = (U32)((BYTE const*)src - window->base);
    U32 const currentCycle = curr & cycleMask;
    /* Ensure newCurrent - maxDist >= ZSTD_WINDOW_START_INDEX. */
    U32 const currentCycleCorrection = currentCycle < ZSTD_WINDOW_START_INDEX
                                     ? MAX(cycleSize, ZSTD_WINDOW_START_INDEX)
                                     : 0;
    U32 const newCurrent = currentCycle
                         + currentCycleCorrection
                         + MAX(maxDist, cycleSize);
    U32 const correction = curr - newCurrent;
    /* maxDist must be a power of two so that:
     *   (newCurrent & cycleMask) == (curr & cycleMask)
     * This is required to not corrupt the chains / binary tree.
     */
    assert((maxDist & (maxDist - 1)) == 0);
    assert((curr & cycleMask) == (newCurrent & cycleMask));
    assert(curr > newCurrent);
    if (!ZSTD_WINDOW_OVERFLOW_CORRECT_FREQUENTLY) {
        /* Loose bound, should be around 1<<29 (see above) */
        assert(correction > 1<<28);
    }

    window->base += correction;
    window->dictBase += correction;
    if (window->lowLimit < correction + ZSTD_WINDOW_START_INDEX) {
        window->lowLimit = ZSTD_WINDOW_START_INDEX;
    } else {
        window->lowLimit -= correction;
    }
    if (window->dictLimit < correction + ZSTD_WINDOW_START_INDEX) {
        window->dictLimit = ZSTD_WINDOW_START_INDEX;
    } else {
        window->dictLimit -= correction;
    }

    /* Ensure we can still reference the full window. */
    assert(newCurrent >= maxDist);
    assert(newCurrent - maxDist >= ZSTD_WINDOW_START_INDEX);
    /* Ensure that lowLimit and dictLimit didn't underflow. */
    assert(window->lowLimit <= newCurrent);
    assert(window->dictLimit <= newCurrent);

    ++window->nbOverflowCorrections;

    DEBUGLOG(4, "Correction of 0x%x bytes to lowLimit=0x%x", correction,
             window->lowLimit);
    return correction;
}